

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O2

void __thiscall mario::TcpClient::~TcpClient(TcpClient *this)

{
  MutexLock *__mutex;
  EventLoop *pEVar1;
  TcpConnectionPtr conn;
  CloseCallback cb;
  __shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2> local_b8;
  function<void_(const_std::shared_ptr<mario::TcpConnection>_&)> local_a8;
  _Bind<void_(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>,_std::function<void_(const_std::shared_ptr<mario::TcpConnection>_&)>))(const_std::function<void_(const_std::shared_ptr<mario::TcpConnection>_&)>_&)>
  local_88;
  Functor local_48;
  code *local_28;
  undefined8 local_20;
  
  local_b8._M_ptr = (element_type *)0x0;
  local_b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __mutex = &this->_mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  std::__shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_b8,
             &(this->_connection).
              super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (local_b8._M_ptr == (element_type *)0x0) {
    Connector::stop((this->_connector).
                    super___shared_ptr<mario::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    pEVar1 = this->_loop;
    local_a8.super__Function_base._M_functor._M_unused._M_object = detail::removeConnector;
    std::__shared_ptr<mario::Connector,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<mario::Connector,_(__gnu_cxx::_Lock_policy)2> *)((long)&local_a8 + 8),
               &(this->_connector).super___shared_ptr<mario::Connector,_(__gnu_cxx::_Lock_policy)2>)
    ;
    std::function<void()>::
    function<std::_Bind<void(*(std::shared_ptr<mario::Connector>))(std::shared_ptr<mario::Connector>const&)>,void>
              ((function<void()> *)&local_88,
               (_Bind<void_(*(std::shared_ptr<mario::Connector>))(const_std::shared_ptr<mario::Connector>_&)>
                *)&local_a8);
    EventLoop::runAfter(pEVar1,1.0,(TimerCallback *)&local_88);
    std::_Function_base::~_Function_base((_Function_base *)&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_a8.super__Function_base._M_manager);
  }
  else {
    local_88._M_f = (offset_in_TcpConnection_to_subr)detail::removeConnection;
    local_88._8_8_ = this->_loop;
    std::function<void(std::shared_ptr<mario::TcpConnection>const&)>::
    function<std::_Bind<void(*(mario::EventLoop*,std::_Placeholder<1>))(mario::EventLoop*,std::shared_ptr<mario::TcpConnection>const&)>,void>
              ((function<void(std::shared_ptr<mario::TcpConnection>const&)> *)&local_a8,
               (_Bind<void_(*(mario::EventLoop_*,_std::_Placeholder<1>))(mario::EventLoop_*,_const_std::shared_ptr<mario::TcpConnection>_&)>
                *)&local_88);
    pEVar1 = this->_loop;
    local_28 = TcpConnection::setCloseCallback;
    local_20 = 0;
    std::
    _Bind<void(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>,std::function<void(std::shared_ptr<mario::TcpConnection>const&)>))(std::function<void(std::shared_ptr<mario::TcpConnection>const&)>const&)>
    ::
    _Bind<std::shared_ptr<mario::TcpConnection>&,std::function<void(std::shared_ptr<mario::TcpConnection>const&)>&>
              ((_Bind<void(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>,std::function<void(std::shared_ptr<mario::TcpConnection>const&)>))(std::function<void(std::shared_ptr<mario::TcpConnection>const&)>const&)>
                *)&local_88,(offset_in_TcpConnection_to_subr *)&local_28,
               (shared_ptr<mario::TcpConnection> *)&local_b8,&local_a8);
    std::function<void()>::
    function<std::_Bind<void(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>,std::function<void(std::shared_ptr<mario::TcpConnection>const&)>))(std::function<void(std::shared_ptr<mario::TcpConnection>const&)>const&)>,void>
              ((function<void()> *)&local_48,&local_88);
    EventLoop::runInLoop(pEVar1,&local_48);
    std::_Function_base::~_Function_base(&local_48.super__Function_base);
    std::
    _Tuple_impl<0UL,_std::shared_ptr<mario::TcpConnection>,_std::function<void_(const_std::shared_ptr<mario::TcpConnection>_&)>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_std::shared_ptr<mario::TcpConnection>,_std::function<void_(const_std::shared_ptr<mario::TcpConnection>_&)>_>
                    *)((long)&local_88 + 0x10));
    std::_Function_base::~_Function_base(&local_a8.super__Function_base);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_connection).
              super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pthread_mutex_destroy((pthread_mutex_t *)__mutex);
  std::_Function_base::~_Function_base(&(this->_messageCallback).super__Function_base);
  std::_Function_base::~_Function_base(&(this->_connectionCallback).super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_connector).super___shared_ptr<mario::Connector,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TcpClient::~TcpClient() {
    TcpConnectionPtr conn;
    {
        MutexLockGuard lock(_mutex);
        conn = _connection;
    }

    if (conn) {
        CloseCallback cb = std::bind(&detail::removeConnection, _loop, _1);
        _loop->runInLoop(
                std::bind(&TcpConnection::setCloseCallback, conn, cb)
                );
    } else {
        _connector->stop();
        _loop->runAfter(1, std::bind(&detail::removeConnector, _connector));
    }
}